

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemiterator_unix.cpp
# Opt level: O2

void __thiscall QFileSystemIterator::~QFileSystemIterator(QFileSystemIterator *this)

{
  QStringConverterBase::State::clear(&(this->toUtf16).super_QStringConverter.state);
  std::unique_ptr<__dirstream,_QFileSystemIterator::DirStreamCloser>::~unique_ptr(&this->dir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

QFileSystemIterator::~QFileSystemIterator() = default;